

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::DescriptorProto_ExtensionRange::ByteSizeLong(DescriptorProto_ExtensionRange *this)

{
  int iVar1;
  size_t sVar2;
  DescriptorProto_ExtensionRange *in_RDI;
  int cached_size;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  DescriptorProto_ExtensionRange *metadata;
  size_t local_28;
  
  local_28 = 0;
  uVar3 = (in_RDI->_has_bits_).has_bits_[0];
  metadata = in_RDI;
  if ((uVar3 & 7) != 0) {
    if ((uVar3 & 1) != 0) {
      sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::ExtensionRangeOptions>
                        ((ExtensionRangeOptions *)0x4f208a);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 2) != 0) {
      _internal_start(in_RDI);
      sVar2 = internal::WireFormatLite::Int32Size(0);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 4) != 0) {
      _internal_end(in_RDI);
      sVar2 = internal::WireFormatLite::Int32Size(0);
      local_28 = sVar2 + 1 + local_28;
    }
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    local_28 = internal::ComputeUnknownFieldsSize
                         ((InternalMetadataWithArena *)metadata,local_28,
                          (CachedSize *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
  }
  else {
    iVar1 = internal::ToCachedSize(local_28);
    SetCachedSize((DescriptorProto_ExtensionRange *)CONCAT44(uVar3,iVar1),
                  (int)((ulong)in_RDI >> 0x20));
  }
  return local_28;
}

Assistant:

size_t DescriptorProto_ExtensionRange::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.DescriptorProto.ExtensionRange)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    // optional .google.protobuf.ExtensionRangeOptions options = 3;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional int32 start = 1;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_start());
    }

    // optional int32 end = 2;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_end());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}